

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O1

AActor * P_BlockmapSearch(AActor *mo,int distance,_func_AActor_ptr_AActor_ptr_int_void_ptr *check,
                         void *params)

{
  int iVar1;
  int iVar2;
  AActor *pAVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  bool bVar13;
  
  iVar4 = (int)(((mo->__Pos).X - bmaporgx) * 0.0078125);
  iVar8 = (int)(((mo->__Pos).Y - bmaporgy) * 0.0078125);
  validcount = validcount + 1;
  if (((((iVar4 < 0) || (iVar8 < 0)) || (bmapwidth <= iVar4)) ||
      ((bmapheight <= iVar8 ||
       (pAVar3 = (*check)(mo,bmapwidth * iVar8 + iVar4,params), pAVar3 == (AActor *)0x0)))) &&
     (pAVar3 = (AActor *)0x0, 0 < distance)) {
    iVar10 = 1;
    do {
      iVar1 = bmapwidth;
      iVar5 = iVar4 - iVar10;
      iVar12 = bmapwidth + -1;
      iVar9 = iVar12;
      if (iVar5 < iVar12) {
        iVar9 = iVar5;
      }
      if (iVar5 < 1) {
        iVar9 = 0;
      }
      iVar6 = iVar8 - iVar10;
      iVar5 = bmapheight + -1;
      iVar11 = iVar5;
      if (iVar6 < iVar5) {
        iVar11 = iVar6;
      }
      if (iVar6 < 1) {
        iVar11 = 0;
      }
      iVar6 = iVar10 + iVar4;
      if ((-1 < iVar6) && (iVar7 = iVar10 + iVar8, -1 < iVar7)) {
        iVar2 = iVar11 * bmapwidth + iVar9;
        if (iVar6 < bmapwidth) {
          iVar12 = iVar6;
        }
        if (iVar7 < bmapheight) {
          iVar5 = iVar7;
        }
        iVar6 = iVar2;
        if (iVar9 <= iVar12) {
          iVar11 = iVar11 * bmapwidth + iVar12;
          if (iVar11 < iVar2) {
            iVar11 = iVar2;
          }
          do {
            pAVar3 = (*check)(mo,iVar6,params);
            if (pAVar3 != (AActor *)0x0) {
              return pAVar3;
            }
            iVar6 = iVar6 + 1;
          } while (iVar11 + 1 != iVar6);
        }
        for (iVar6 = iVar6 + -1; iVar6 <= iVar12 + iVar5 * iVar1; iVar6 = iVar6 + bmapwidth) {
          pAVar3 = (*check)(mo,iVar6,params);
          if (pAVar3 != (AActor *)0x0) {
            return pAVar3;
          }
        }
        iVar9 = iVar5 * iVar1 + iVar9;
        iVar6 = iVar6 - bmapwidth;
        iVar12 = iVar6;
        if (iVar9 <= iVar6) {
          do {
            pAVar3 = (*check)(mo,iVar12,params);
            if (pAVar3 != (AActor *)0x0) {
              return pAVar3;
            }
            iVar6 = iVar12 + -1;
            bVar13 = iVar9 < iVar12;
            iVar12 = iVar6;
          } while (bVar13);
        }
        if (iVar2 <= iVar6) {
          iVar6 = iVar6 + 1;
          do {
            pAVar3 = (*check)(mo,iVar6,params);
            if (pAVar3 != (AActor *)0x0) {
              return pAVar3;
            }
            iVar6 = iVar6 - bmapwidth;
          } while (iVar2 < iVar6);
        }
      }
      bVar13 = iVar10 != distance;
      pAVar3 = (AActor *)0x0;
      iVar10 = iVar10 + 1;
    } while (bVar13);
  }
  return pAVar3;
}

Assistant:

AActor *P_BlockmapSearch (AActor *mo, int distance, AActor *(*check)(AActor*, int, void *), void *params)
{
	int blockX;
	int blockY;
	int startX, startY;
	int blockIndex;
	int firstStop;
	int secondStop;
	int thirdStop;
	int finalStop;
	int count;
	AActor *target;

	startX = GetBlockX(mo->X());
	startY = GetBlockY(mo->Y());
	validcount++;
	
	if (startX >= 0 && startX < bmapwidth && startY >= 0 && startY < bmapheight)
	{
		if ( (target = check (mo, startY*bmapwidth+startX, params)) )
		{ // found a target right away
			return target;
		}
	}
	for (count = 1; count <= distance; count++)
	{
		blockX = clamp (startX-count, 0, bmapwidth-1);
		blockY = clamp (startY-count, 0, bmapheight-1);

		blockIndex = blockY*bmapwidth+blockX;
		firstStop = startX+count;
		if (firstStop < 0)
		{
			continue;
		}
		if (firstStop >= bmapwidth)
		{
			firstStop = bmapwidth-1;
		}
		secondStop = startY+count;
		if (secondStop < 0)
		{
			continue;
		}
		if (secondStop >= bmapheight)
		{
			secondStop = bmapheight-1;
		}
		thirdStop = secondStop*bmapwidth+blockX;
		secondStop = secondStop*bmapwidth+firstStop;
		firstStop += blockY*bmapwidth;
		finalStop = blockIndex;		

		// Trace the first block section (along the top)
		for (; blockIndex <= firstStop; blockIndex++)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
		// Trace the second block section (right edge)
		for (blockIndex--; blockIndex <= secondStop; blockIndex += bmapwidth)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}		
		// Trace the third block section (bottom edge)
		for (blockIndex -= bmapwidth; blockIndex >= thirdStop; blockIndex--)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
		// Trace the final block section (left edge)
		for (blockIndex++; blockIndex > finalStop; blockIndex -= bmapwidth)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
	}
	return NULL;	
}